

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envelope.h
# Opt level: O0

clock_t __thiscall EnvelopeGenerator::clock(EnvelopeGenerator *this)

{
  State SVar1;
  uint uVar2;
  reg8 rVar3;
  ulong uVar4;
  cycle_count in_ESI;
  int rate_step;
  cycle_count delta_t_local;
  EnvelopeGenerator *this_local;
  
  rate_step = this->rate_period - this->rate_counter;
  if (rate_step < 1) {
    rate_step = rate_step + 0x7fff;
  }
  uVar4 = (ulong)(uint)rate_step;
  delta_t_local = in_ESI;
  do {
    while( true ) {
      if (delta_t_local == 0) {
        return uVar4;
      }
      if (delta_t_local < rate_step) {
        this->rate_counter = delta_t_local + this->rate_counter;
        uVar2 = this->rate_counter & 0x8000;
        if (uVar2 == 0) {
          return (ulong)uVar2;
        }
        this->rate_counter = this->rate_counter + 1;
        this->rate_counter = this->rate_counter & 0x7fff;
        return (clock_t)this;
      }
      this->rate_counter = 0;
      delta_t_local = delta_t_local - rate_step;
      if ((this->state == ATTACK) ||
         (rVar3 = this->exponential_counter + 1, this->exponential_counter = rVar3,
         rVar3 == this->exponential_counter_period)) break;
LAB_00165809:
      rate_step = this->rate_period;
      uVar4 = (ulong)(uint)rate_step;
    }
    this->exponential_counter = 0;
    if ((this->hold_zero & 1U) == 0) {
      SVar1 = this->state;
      if (SVar1 == ATTACK) {
        this->envelope_counter = this->envelope_counter + 1;
        this->envelope_counter = this->envelope_counter & 0xff;
        if (this->envelope_counter == 0xff) {
          this->state = DECAY_SUSTAIN;
          this->rate_period = rate_counter_period[this->decay];
        }
      }
      else if (SVar1 == DECAY_SUSTAIN) {
        if (this->envelope_counter != sustain_level[this->sustain]) {
          this->envelope_counter = this->envelope_counter - 1;
        }
      }
      else if (SVar1 == RELEASE) {
        this->envelope_counter = this->envelope_counter - 1;
        this->envelope_counter = this->envelope_counter & 0xff;
      }
      rVar3 = this->envelope_counter;
      if (rVar3 == 0) {
        this->exponential_counter_period = 1;
        this->hold_zero = true;
      }
      else if (rVar3 == 6) {
        this->exponential_counter_period = 0x1e;
      }
      else if (rVar3 == 0xe) {
        this->exponential_counter_period = 0x10;
      }
      else if (rVar3 == 0x1a) {
        this->exponential_counter_period = 8;
      }
      else if (rVar3 == 0x36) {
        this->exponential_counter_period = 4;
      }
      else if (rVar3 == 0x5d) {
        this->exponential_counter_period = 2;
      }
      else if (rVar3 == 0xff) {
        this->exponential_counter_period = 1;
      }
      goto LAB_00165809;
    }
    rate_step = this->rate_period;
    uVar4 = (ulong)(uint)rate_step;
  } while( true );
}

Assistant:

RESID_INLINE
void EnvelopeGenerator::clock(cycle_count delta_t)
{
  // Check for ADSR delay bug.
  // If the rate counter comparison value is set below the current value of the
  // rate counter, the counter will continue counting up until it wraps around
  // to zero at 2^15 = 0x8000, and then count rate_period - 1 before the
  // envelope can finally be stepped.
  // This has been verified by sampling ENV3.
  //

  // NB! This requires two's complement integer.
  int rate_step = rate_period - rate_counter;
  if (rate_step <= 0) {
    rate_step += 0x7fff;
  }

  while (delta_t) {
    if (delta_t < rate_step) {
      rate_counter += delta_t;
      if (rate_counter & 0x8000) {
	++rate_counter &= 0x7fff;
      }
      return;
    }

    rate_counter = 0;
    delta_t -= rate_step;

    // The first envelope step in the attack state also resets the exponential
    // counter. This has been verified by sampling ENV3.
    //
    if (state == ATTACK	|| ++exponential_counter == exponential_counter_period)
    {
      exponential_counter = 0;

      // Check whether the envelope counter is frozen at zero.
      if (hold_zero) {
	rate_step = rate_period;
	continue;
      }

      switch (state) {
      case ATTACK:
	// The envelope counter can flip from 0xff to 0x00 by changing state to
	// release, then to attack. The envelope counter is then frozen at
	// zero; to unlock this situation the state must be changed to release,
	// then to attack. This has been verified by sampling ENV3.
	//
	++envelope_counter &= 0xff;
	if (envelope_counter == 0xff) {
	  state = DECAY_SUSTAIN;
	  rate_period = rate_counter_period[decay];
	}
	break;
      case DECAY_SUSTAIN:
	if (envelope_counter != sustain_level[sustain]) {
	  --envelope_counter;
	}
	break;
      case RELEASE:
	// The envelope counter can flip from 0x00 to 0xff by changing state to
	// attack, then to release. The envelope counter will then continue
	// counting down in the release state.
	// This has been verified by sampling ENV3.
	// NB! The operation below requires two's complement integer.
	//
	--envelope_counter &= 0xff;
	break;
      }

      // Check for change of exponential counter period.
      switch (envelope_counter) {
      case 0xff:
	exponential_counter_period = 1;
	break;
      case 0x5d:
	exponential_counter_period = 2;
	break;
      case 0x36:
	exponential_counter_period = 4;
	break;
      case 0x1a:
	exponential_counter_period = 8;
	break;
      case 0x0e:
	exponential_counter_period = 16;
	break;
      case 0x06:
	exponential_counter_period = 30;
	break;
      case 0x00:
	exponential_counter_period = 1;

	// When the envelope counter is changed to zero, it is frozen at zero.
	// This has been verified by sampling ENV3.
	hold_zero = true;
	break;
      }
    }

    rate_step = rate_period;
  }
}